

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O0

void __thiscall QToolBox::removeItem(QToolBox *this,int index)

{
  QToolBoxPrivate *this_00;
  QWidget *pQVar1;
  undefined4 in_ESI;
  QWidget *in_RDI;
  QWidget *unaff_retaddr;
  QWidget *w;
  QToolBoxPrivate *d;
  QToolBoxPrivate *in_stack_00000028;
  undefined8 in_stack_ffffffffffffffe0;
  int index_00;
  QWidget *parent;
  
  index_00 = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  parent = in_RDI;
  this_00 = d_func((QToolBox *)0x703e0f);
  pQVar1 = widget((QToolBox *)this_00,index_00);
  if (pQVar1 != (QWidget *)0x0) {
    QObject::disconnect(&pQVar1->super_QObject,"2destroyed(QObject*)",&in_RDI->super_QObject,
                        "1_q_widgetDestroyed(QObject*)");
    QWidget::setParent(unaff_retaddr,parent);
    QToolBoxPrivate::_q_widgetDestroyed(in_stack_00000028,(QObject *)this);
    (**(code **)(*(long *)in_RDI + 0x1b0))(in_RDI,in_ESI);
  }
  return;
}

Assistant:

void QToolBox::removeItem(int index)
{
    Q_D(QToolBox);
    if (QWidget *w = widget(index)) {
        disconnect(w, SIGNAL(destroyed(QObject*)), this, SLOT(_q_widgetDestroyed(QObject*)));
        w->setParent(this);
        // destroy internal data
        d->_q_widgetDestroyed(w);
        itemRemoved(index);
    }
}